

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_open_memory.c
# Opt level: O0

ssize_t memory_read(archive *a,void *client_data,void **buff)

{
  ssize_t size;
  read_memory_data_conflict *mine;
  void **buff_local;
  void *client_data_local;
  archive *a_local;
  
  *buff = *(void **)((long)client_data + 8);
  size = *(long *)((long)client_data + 0x10) - *(long *)((long)client_data + 8);
  if (*(long *)((long)client_data + 0x18) < size) {
    size = *(ssize_t *)((long)client_data + 0x18);
  }
  *(ssize_t *)((long)client_data + 8) = size + *(long *)((long)client_data + 8);
  return size;
}

Assistant:

static ssize_t
memory_read(struct archive *a, void *client_data, const void **buff)
{
	struct read_memory_data *mine = (struct read_memory_data *)client_data;
	ssize_t size;

	(void)a; /* UNUSED */
	size = mine->end - mine->p;
	if (size < 0) {
		buff = NULL;
		return 0;
	}
	if ((size_t)size > mine->read_size)
		size = mine->read_size;
	else
		memset(mine->copy_buff, 0xA5, mine->copy_buff_size);
	memcpy(mine->copy_buff + mine->copy_buff_offset, mine->p, size);
	*buff = mine->copy_buff + mine->copy_buff_offset;

        mine->p += size;
	return ((ssize_t)size);
}